

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O2

void __thiscall
TPZContBufferedStream::WriteToBuffer(TPZContBufferedStream *this,char *source,size_t *nBytes)

{
  size_t __n;
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  size_t oldSize;
  size_t local_38;
  
  local_38 = this->fSize;
  __n = *nBytes;
  if ((char *)this->fNAllocatedBytes < this->fFirst + __n + (local_38 - (long)this->fBuffer)) {
    auVar5._8_4_ = (int)(local_38 >> 0x20);
    auVar5._0_8_ = local_38;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(__n >> 0x20);
    auVar6._0_8_ = __n;
    auVar6._12_4_ = 0x45300000;
    dVar7 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 1.1 +
            (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0) + 1.0;
    uVar2 = (ulong)dVar7;
    uVar2 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    pcVar3 = (char *)operator_new__(uVar2);
    (*(this->super_TPZStream)._vptr_TPZStream[0x3b])(this,pcVar3,&local_38);
    sVar4 = local_38;
    memcpy(pcVar3 + local_38,source,*nBytes);
    if (this->fBuffer != (char *)0x0) {
      operator_delete__(this->fBuffer);
      sVar4 = local_38;
    }
    this->fBuffer = pcVar3;
    this->fNAllocatedBytes = uVar2;
    this->fFirst = pcVar3;
    sVar1 = *nBytes;
    this->fSize = sVar4 + sVar1;
    this->fLast = pcVar3 + ((sVar4 + sVar1) - 1);
  }
  else {
    memcpy(this->fLast + 1,source,__n);
    sVar4 = *nBytes;
    this->fLast = this->fLast + sVar4;
    this->fSize = this->fSize + sVar4;
  }
  return;
}

Assistant:

void TPZContBufferedStream::WriteToBuffer(const char *source,
        const size_t &nBytes) {
    if (fFirst - fBuffer + fSize + nBytes > fNAllocatedBytes) {
        const size_t oldSize = fSize;
        const size_t newAllocatedBytes =
                oldSize * 1.1 + nBytes +
                MIN_SIZE_INCREMENT; // 10% increase + nBytes + MIN_SIZE_INCREMENT
        char *temp = new char[newAllocatedBytes];
        ConstReadFromBuffer(temp, oldSize);
        memcpy(temp + oldSize, source, nBytes);
        delete[] fBuffer;
        fBuffer = temp;
        fNAllocatedBytes = newAllocatedBytes;
        fFirst = fBuffer;
        fSize = oldSize + nBytes;
        fLast = fBuffer - 1 + fSize;
    } else {
        memcpy(fLast + 1, source, nBytes);
        fLast += nBytes;
        fSize += nBytes;
    }
}